

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDisabledOverrideReenable(void)

{
  byte *pbVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  (GImGui->Style).Alpha = GImGui->DisabledAlphaBackup;
  pbVar1 = (byte *)((long)&pIVar2->CurrentItemFlags + 1);
  *pbVar1 = *pbVar1 & 0xfb;
  ImVector<int>::push_back(&pIVar2->ItemFlagsStack,&pIVar2->CurrentItemFlags);
  pIVar2->DisabledStackSize = pIVar2->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabledOverrideReenable()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentItemFlags & ImGuiItemFlags_Disabled);
    g.Style.Alpha = g.DisabledAlphaBackup;
    g.CurrentItemFlags &= ~ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}